

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsscreen.cpp
# Opt level: O1

QString * __thiscall QEglFSKmsScreen::model(QString *__return_storage_ptr__,QEglFSKmsScreen *this)

{
  Data *pDVar1;
  QEdidParser *pQVar2;
  
  pQVar2 = (QEdidParser *)&(this->m_edid).model;
  if ((this->m_edid).model.d.size == 0) {
    pQVar2 = &this->m_edid;
  }
  pDVar1 = (pQVar2->identifier).d.d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (pQVar2->identifier).d.ptr;
  (__return_storage_ptr__->d).size = (pQVar2->identifier).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QEglFSKmsScreen::model() const
{
    return m_edid.model.isEmpty() ? m_edid.identifier : m_edid.model;
}